

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

int64_t __thiscall
mocker::ir::Interpreter::readVal(Interpreter *this,shared_ptr<mocker::ir::Addr> *reg)

{
  bool bVar1;
  const_reference pvVar2;
  element_type *peVar3;
  string *psVar4;
  mapped_type *pmVar5;
  element_type *this_00;
  undefined1 local_60 [8];
  shared_ptr<mocker::ir::IntLiteral> p_2;
  shared_ptr<mocker::ir::Reg> p_1;
  undefined1 local_30 [8];
  shared_ptr<mocker::ir::Reg> p;
  shared_ptr<mocker::ir::Addr> *reg_local;
  Interpreter *this_local;
  
  p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)reg;
  dycLocalReg((ir *)local_30,reg);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    psVar4 = Reg::getIdentifier_abi_cxx11_(peVar3);
    bVar1 = std::operator==(psVar4,".phi_nan");
    if (bVar1) {
      this_local = (Interpreter *)0xffffffffffffff85;
      bVar1 = true;
    }
    else {
      pvVar2 = std::
               stack<mocker::ir::Interpreter::ActivationRecord,_std::deque<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>_>
               ::top(&this->ars);
      peVar3 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      psVar4 = Reg::getIdentifier_abi_cxx11_(peVar3);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::at(&pvVar2->localReg,psVar4);
      this_local = (Interpreter *)*pmVar5;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_30);
  if (!bVar1) {
    dycGlobalReg((ir *)&p_2.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                 (shared_ptr<mocker::ir::Addr> *)
                 p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &p_2.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p_2.
                              super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      psVar4 = Reg::getIdentifier_abi_cxx11_(peVar3);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::at(&this->globalReg,psVar4);
      this_local = (Interpreter *)*pmVar5;
    }
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr
              ((shared_ptr<mocker::ir::Reg> *)
               &p_2.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (!bVar1) {
      dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                ((ir *)local_60,
                 (shared_ptr<mocker::ir::Addr> *)
                 p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
      if (bVar1) {
        this_00 = std::
                  __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_60);
        this_local = (Interpreter *)IntLiteral::getVal(this_00);
      }
      std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
                ((shared_ptr<mocker::ir::IntLiteral> *)local_60);
      if (!bVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                      ,0x26d,
                      "std::int64_t mocker::ir::Interpreter::readVal(const std::shared_ptr<Addr> &) const"
                     );
      }
    }
  }
  return (int64_t)this_local;
}

Assistant:

std::int64_t Interpreter::readVal(const std::shared_ptr<Addr> &reg) const {
  if (auto p = dycLocalReg(reg)) {
    if (p->getIdentifier() == ".phi_nan")
      return -123;
    return ars.top().localReg.at(p->getIdentifier());
  }
  if (auto p = dycGlobalReg(reg)) {
    return globalReg.at(p->getIdentifier());
  }
  if (auto p = dyc<IntLiteral>(reg)) {
    return p->getVal();
  }
  assert(false);
}